

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::OneHotLayerParams::SerializeWithCachedSizes
          (OneHotLayerParams *this,CodedOutputStream *output)

{
  uint64 uVar1;
  int64 iVar2;
  float fVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  OneHotLayerParams *this_local;
  
  uVar1 = onehotvectorsize(this);
  if (uVar1 != 0) {
    uVar1 = onehotvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar2,output);
  }
  fVar3 = onvalue(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = onvalue(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar3,output);
  }
  fVar3 = offvalue(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = offvalue(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar3,output);
  }
  return;
}

Assistant:

void OneHotLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.OneHotLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 oneHotVectorSize = 1;
  if (this->onehotvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->onehotvectorsize(), output);
  }

  // int64 axis = 2;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->axis(), output);
  }

  // float onValue = 3;
  if (this->onvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->onvalue(), output);
  }

  // float offValue = 4;
  if (this->offvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->offvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.OneHotLayerParams)
}